

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event.cpp
# Opt level: O1

void __thiscall cppnet::TimerEvent::OnTimer(TimerEvent *this)

{
  int iVar1;
  ushort uVar2;
  element_type *peVar3;
  int iVar4;
  SingletonLogger *this_00;
  long *plVar5;
  undefined8 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_RBX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar7;
  void *local_18;
  
  uVar2 = (this->super_Event)._event_type;
  if ((uVar2 & 0x10) == 0) {
    if ((uVar2 & 8) == 0) {
      this_00 = Singleton<cppnet::SingletonLogger>::Instance();
      SingletonLogger::Error
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/timer_event.cpp"
                 ,0x1b,"invalid timer type. type:%d",(ulong)(this->super_Event)._event_type);
      return;
    }
    this_01 = (this->super_Event)._socket.
              super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar4 = this_01->_M_use_count;
      do {
        if (iVar4 == 0) {
          this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = this_01->_M_use_count;
        bVar7 = iVar4 == iVar1;
        if (bVar7) {
          this_01->_M_use_count = iVar4 + 1;
          iVar1 = iVar4;
        }
        iVar4 = iVar1;
        UNLOCK();
      } while (!bVar7);
    }
    if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar7 = true;
    }
    else {
      bVar7 = this_01->_M_use_count == 0;
    }
    peVar3 = (this->super_Event)._socket.
             super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((bool)(peVar3 == (element_type *)0x0 | bVar7)) {
      plVar5 = (long *)0x0;
    }
    else {
      plVar5 = (long *)__dynamic_cast(peVar3,&Socket::typeinfo,&RWSocket::typeinfo,0);
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    (**(code **)(*plVar5 + 0x68))();
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      return;
    }
  }
  else {
    local_18 = (this->super_Event)._data;
    if ((this->_timer_cb).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar6 = std::__throw_bad_function_call();
      if (unaff_RBX != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_RBX);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_RBX);
      }
      _Unwind_Resume(uVar6);
    }
    (*(this->_timer_cb)._M_invoker)((_Any_data *)&this->_timer_cb,&local_18);
  }
  return;
}

Assistant:

void TimerEvent::OnTimer() {
    if (GetType() & ET_USER_TIMER) {
        _timer_cb(GetData());

    } else if (GetType() & ET_TIMER) {
        auto sock = GetSocket();
        auto rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
        rw_sock->OnTimer();

    } else {
        LOG_ERROR("invalid timer type. type:%d", GetType());
    }
}